

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Func.cpp
# Opt level: O2

int __thiscall Func::GetForInEnumeratorArrayOffset(Func *this)

{
  uint uVar1;
  Func *pFVar2;
  code *pcVar3;
  bool bVar4;
  uint uVar5;
  JITTimeFunctionBody *this_00;
  undefined4 *puVar6;
  
  pFVar2 = this->topFunc;
  uVar1 = this->m_forInLoopBaseDepth;
  this_00 = GetJITFunctionBody(this);
  uVar5 = JITTimeFunctionBody::GetForInLoopDepth(this_00);
  if (pFVar2->m_forInLoopMaxDepth < uVar5 + uVar1) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar6 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Func.cpp"
                       ,0x826,
                       "(this->m_forInLoopBaseDepth + this->GetJITFunctionBody()->GetForInLoopDepth() <= topFunc->m_forInLoopMaxDepth)"
                       ,
                       "this->m_forInLoopBaseDepth + this->GetJITFunctionBody()->GetForInLoopDepth() <= topFunc->m_forInLoopMaxDepth"
                      );
    if (!bVar4) {
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    *puVar6 = 0;
  }
  return this->m_forInLoopBaseDepth * 0x58 + pFVar2->m_forInEnumeratorArrayOffset;
}

Assistant:

int
Func::GetForInEnumeratorArrayOffset() const
{
    Func const* topFunc = this->GetTopFunc();
    Assert(this->m_forInLoopBaseDepth + this->GetJITFunctionBody()->GetForInLoopDepth() <= topFunc->m_forInLoopMaxDepth);
    return topFunc->m_forInEnumeratorArrayOffset
        + this->m_forInLoopBaseDepth * sizeof(Js::ForInObjectEnumerator);
}